

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O3

void vectorize_use_func(Item *qname,Item *qpar1,Item *qexpr,Item *qpar2,int blocktype)

{
  int iVar1;
  Item *qexpr_00;
  Item *extraout_RDX;
  Item *extraout_RDX_00;
  Item *pIVar2;
  Item *qexpr_01;
  char *pcVar3;
  char *s2;
  
  if ((((qname->element).sym)->subtype & 0x8000) == 0) {
    pIVar2 = qpar1->next;
    if (qexpr == (Item *)0x0) {
      pcVar3 = "_threadargs_";
    }
    else {
      pcVar3 = "_threadargscomma_";
    }
  }
  else {
    pcVar3 = ((qname->element).sym)->name;
    iVar1 = strcmp(pcVar3,"nrn_pointing");
    if (iVar1 == 0) {
      pIVar2 = qpar1->next;
      pcVar3 = "&";
    }
    else {
      iVar1 = strcmp(pcVar3,"state_discontinuity");
      if (iVar1 == 0) {
        vectorize_use_func_cold_1();
        return;
      }
      iVar1 = strcmp(pcVar3,"net_send");
      if (iVar1 != 0) {
        iVar1 = strcmp(pcVar3,"net_event");
        if (iVar1 == 0) {
          net_event_seen_ = 1;
          if (blocktype == 0x16a) {
            acc_net_add(qname,qpar1,qexpr_00,qpar2,"1, -1, -1,  _ppvar[1*_STRIDE],",", 0.");
            pIVar2 = qpar1->next;
            pcVar3 = "_pnt,";
            goto LAB_001128d5;
          }
          pcVar3 = "net_event";
        }
        else {
          iVar1 = strcmp(pcVar3,"net_move");
          if (iVar1 != 0) {
            return;
          }
          pIVar2 = extraout_RDX;
          if (artificial_cell != 0) {
            replacstr(qname,"artcell_net_move");
            pIVar2 = extraout_RDX_00;
          }
          if (blocktype == 0x16a) {
            acc_net_add(qname,qpar1,pIVar2,qpar2,"2, _tqitem, -1, _ppvar[1*_STRIDE],",", 0.");
            pIVar2 = qpar1->next;
            pcVar3 = "_tqitem, _pnt,";
            goto LAB_001128d5;
          }
          pcVar3 = "net_move";
        }
        s2 = " only allowed in NET_RECEIVE block";
LAB_001129fe:
        diag(pcVar3,s2);
      }
      net_send_seen_ = 1;
      if (artificial_cell != 0) {
        replacstr(qname,"artcell_net_send");
      }
      insertstr(qexpr,"t + ");
      if (blocktype == 0x109) {
        net_send_buffer_in_initial = 1;
        acc_net_add(qname,qpar1,qexpr_01,qpar2,"0, _tqitem, 0,  _ppvar[1*_STRIDE],","");
        pIVar2 = qpar1->next;
        pcVar3 = "_tqitem, -1, (Point_process*) _nt->_vdata[_ppvar[1*_STRIDE]],";
      }
      else {
        if (blocktype != 0x16a) {
          pcVar3 = "net_send allowed only in INITIAL and NET_RECEIVE blocks";
          s2 = (char *)0x0;
          goto LAB_001129fe;
        }
        acc_net_add(qname,qpar1,qexpr_01,qpar2,"0, _tqitem, _weight_index, _ppvar[1*_STRIDE],","");
        pIVar2 = qpar1->next;
        pcVar3 = "_tqitem, _weight_index, _pnt,";
      }
    }
  }
LAB_001128d5:
  insertstr(pIVar2,pcVar3);
  return;
}

Assistant:

void vectorize_use_func(qname, qpar1, qexpr, qpar2, blocktype)
	Item* qname, *qpar1, *qexpr, *qpar2;
	int blocktype;
{
	Item* q;
	if (SYM(qname)->subtype &  EXTDEF) {
		if (strcmp(SYM(qname)->name, "nrn_pointing") == 0) {
			Insertstr(qpar1->next, "&");
		}else if (strcmp(SYM(qname)->name, "state_discontinuity") == 0) {
#if CVODE
fprintf(stderr, "Notice: Use of state_discontinuity is not thread safe");
			vectorize = 0;
			if (blocktype == NETRECEIVE) {
Fprintf(stderr, "Notice: Use of state_discontinuity in a NET_RECEIVE block is unnecessary and prevents use of this mechanism in a multithreaded simulation.\n");
			}
			if (!state_discon_list_) {
				state_discon_list_ = newlist();
			}
			lappenditem(state_discon_list_, qpar1->next);
#endif
			Insertstr(qpar1->next, "-1, &");
		}else if (strcmp(SYM(qname)->name, "net_send") == 0) {
			net_send_seen_ = 1;
			if (artificial_cell) {
				replacstr(qname, "artcell_net_send");
			}
			Insertstr(qexpr, "t + ");
			if (blocktype == NETRECEIVE) {
acc_net_add(qname, qpar1, qexpr, qpar2, "0, _tqitem, _weight_index, _ppvar[1*_STRIDE],", "");
				Insertstr(qpar1->next, "_tqitem, _weight_index, _pnt,");
			}else if (blocktype == INITIAL1){
			  net_send_buffer_in_initial = 1;
acc_net_add(qname, qpar1, qexpr, qpar2, "0, _tqitem, 0,  _ppvar[1*_STRIDE],", "");
				Insertstr(qpar1->next, "_tqitem, -1, (Point_process*) _nt->_vdata[_ppvar[1*_STRIDE]],");
			}else{
diag("net_send allowed only in INITIAL and NET_RECEIVE blocks", (char*)0);
			}
		}else if (strcmp(SYM(qname)->name, "net_event") == 0) {
			net_event_seen_ = 1;
			if (blocktype == NETRECEIVE) {
acc_net_add(qname, qpar1, qexpr, qpar2, "1, -1, -1,  _ppvar[1*_STRIDE],", ", 0.");
				Insertstr(qpar1->next, "_pnt,");
			}else{
diag("net_event", " only allowed in NET_RECEIVE block");
			}
		}else if (strcmp(SYM(qname)->name, "net_move") == 0) {
			if (artificial_cell) {
				replacstr(qname, "artcell_net_move");
			}
			if (blocktype == NETRECEIVE) {
acc_net_add(qname, qpar1, qexpr, qpar2, "2, _tqitem, -1, _ppvar[1*_STRIDE],", ", 0.");
				Insertstr(qpar1->next, "_tqitem, _pnt,");
			}else{
diag("net_move", " only allowed in NET_RECEIVE block");
			}
		}
		return;
	}
#if 1
	if (qexpr) {
		q = insertstr(qpar1->next, "_threadargscomma_");
	}else{
		q = insertstr(qpar1->next, "_threadargs_");
	}
#else
	q = insertstr(qpar1->next, "");
	if (qexpr) {
		vectorize_substitute(q, "_threadargs_,");
	}else{
		vectorize_substitute(q, "_threadargs_");
	}
#endif
}